

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cpp
# Opt level: O0

uint booster::ptime::sleep(uint __seconds)

{
  int iVar1;
  int *piVar2;
  undefined7 uVar3;
  undefined4 in_register_0000003c;
  timespec tsr;
  timespec ts;
  bool local_29;
  timespec local_28;
  timespec local_18;
  __time_t *local_8;
  
  local_8 = (__time_t *)CONCAT44(in_register_0000003c,__seconds);
  local_18.tv_sec = *local_8;
  local_18.tv_nsec = (long)(int)local_8[1];
  while( true ) {
    iVar1 = nanosleep(&local_18,&local_28);
    uVar3 = 0;
    local_29 = false;
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      local_29 = *piVar2 == 4;
      uVar3 = (undefined7)((ulong)piVar2 >> 8);
    }
    if (local_29 == false) break;
    local_18.tv_sec = local_28.tv_sec;
    local_18.tv_nsec = local_28.tv_nsec;
  }
  return (uint)CONCAT71(uVar3,local_29);
}

Assistant:

void ptime::sleep(ptime const &p)
{
	#ifndef BOOSTER_WIN_NATIVE
	struct timespec ts,tsr;
	ts.tv_sec = p.sec;
	ts.tv_nsec = p.nsec;
	while(::nanosleep(&ts,&tsr) < 0 && errno==EINTR)
		ts=tsr;
	#else
	ptime n = now();
	ptime end = n + p;
	while(end > n) {
		::Sleep(DWORD(milliseconds(end - n)));
		n = now();
	}
	#endif
}